

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGNSPlanner.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
PerseusBGNSPlanner::BackupStageSampling(PerseusBGNSPlanner *this,BeliefSet *S,QFunctionsDiscrete *Q)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  size_t sVar5;
  JointBeliefInterface *b_00;
  GaoVectorSet *G;
  ValueFunctionPOMDPDiscrete *V_00;
  const_reference ppJVar6;
  long *plVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  reference this_00;
  reference pvVar9;
  ostream *poVar10;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *this_01;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RCX;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_RDX;
  long in_RSI;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RDI;
  reference rVar11;
  reference rVar12;
  int b;
  int nrImprovedByAlpha;
  double x;
  uint a_1;
  ValueFunctionPOMDPDiscrete Qalphas;
  GaoVectorSet Gao;
  ValueFunctionPOMDPDiscrete V;
  AlphaVector alpha;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  double oldValue;
  int k;
  int nrS;
  int nrNotImproved;
  int nrB;
  uint a;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  QB;
  vector<double,_std::allocator<double>_> VBalpha;
  vector<double,_std::allocator<double>_> VB;
  QFunctionsDiscrete *Q1;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffb80;
  AlphaVector *in_stack_fffffffffffffb88;
  ostream *in_stack_fffffffffffffb90;
  ostream *in_stack_fffffffffffffb98;
  AlphaVector *in_stack_fffffffffffffba0;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffba8;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffffbb0;
  QFunctionsDiscrete *in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbc4;
  _Bit_type in_stack_fffffffffffffbc8;
  _Bit_type *in_stack_fffffffffffffbd0;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffbd8;
  uint in_stack_fffffffffffffbe4;
  _Bit_type in_stack_fffffffffffffbe8;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  ostream *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc08;
  QFunctionsDiscrete *in_stack_fffffffffffffc30;
  GaoVectorSet *in_stack_fffffffffffffc38;
  Perseus *in_stack_fffffffffffffc40;
  undefined1 *puVar13;
  AlphaVectorBG *this_02;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_stack_fffffffffffffcd0
  ;
  reference local_288;
  reference local_278;
  int local_268;
  int local_264;
  double local_220;
  uint local_1ec;
  AlphaVector local_110;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_b2 [98];
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> local_38;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *local_20;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  BeliefValue::GetValues((BeliefSet *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x95efe4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x95eff1);
  for (local_b2._70_4_ = 0; uVar3 = (ulong)(uint)local_b2._70_4_,
      sVar4 = std::
              vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              ::size(local_20), uVar3 != sVar4; local_b2._70_4_ = local_b2._70_4_ + 1) {
    in_stack_fffffffffffffcd0 = local_18;
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator[](local_20,(ulong)(uint)local_b2._70_4_);
    BeliefValue::GetValues
              ((BeliefSet *)in_stack_fffffffffffffc08,
               (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffc00);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffffb80,
                (value_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_38);
  local_b2._22_4_ = (undefined4)sVar4;
  local_b2._26_4_ = local_b2._22_4_;
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  sVar5 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffb80);
  local_b2._18_4_ = (undefined4)sVar5;
  local_b2[1] = 0;
  b_00 = (JointBeliefInterface *)
         std::
         vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
         ::size(local_20);
  this_02 = (AlphaVectorBG *)local_b2;
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x95f180);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98,
           (allocator_type *)in_stack_fffffffffffffb90);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x95f1ac);
  G = (GaoVectorSet *)(long)(int)local_b2._26_4_;
  local_e1 = 1;
  puVar13 = &local_e2;
  std::allocator<bool>::allocator((allocator<bool> *)0x95f1d9);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffba0,
             (size_type)in_stack_fffffffffffffb98,(bool *)in_stack_fffffffffffffb90,
             (allocator_type *)in_stack_fffffffffffffb88);
  std::allocator<bool>::~allocator((allocator<bool> *)0x95f20d);
  AlphaVector::AlphaVector(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
  AlphaVectorPlanning::QFunctionsToValueFunction(in_stack_fffffffffffffbb8);
  Perseus::BackupStageLeadIn
            ((Perseus *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
             in_stack_fffffffffffffbf0);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x95f26b);
  rVar11._M_mask = in_stack_fffffffffffffbe8;
  rVar11._M_p = (_Bit_type *)in_stack_fffffffffffffbf0;
  rVar12._M_mask = in_stack_fffffffffffffbc8;
  rVar12._M_p = in_stack_fffffffffffffbd0;
  while (local_b2._22_4_ != 0) {
    V_00 = (ValueFunctionPOMDPDiscrete *)(in_RSI + 0x18);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc40,
               (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc38);
    local_b2._14_4_ =
         Perseus::SampleNotImprovedBeliefIndex
                   ((Perseus *)rVar12._M_p,(vector<bool,_std::allocator<bool>_> *)rVar12._M_mask,
                    in_stack_fffffffffffffbc4);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x95f2e4);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x95f2f1);
    local_1ec = 0;
    while( true ) {
      uVar3 = (ulong)local_1ec;
      AlphaVectorPlanning::GetPU
                ((AlphaVectorPlanning *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      sVar5 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x95f339);
      if (uVar3 == sVar5) break;
      std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::operator[]
                (local_18,(long)(int)local_b2._14_4_);
      in_stack_fffffffffffffb78 = *(undefined4 *)(in_RSI + 200);
      AlphaVectorBG::BeliefBackup
                (this_02,b_00,(Index)((ulong)puVar13 >> 0x20),G,V_00,
                 (BGBackupType)in_stack_fffffffffffffcd0);
      AlphaVector::operator=(in_stack_fffffffffffffb88,(AlphaVector *)in_stack_fffffffffffffb80);
      AlphaVector::~AlphaVector((AlphaVector *)0x95f3d1);
      ppJVar6 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                operator[](local_18,(long)(int)local_b2._14_4_);
      plVar7 = (long *)((long)&(*ppJVar6)->field_0x0 + *(long *)((long)**ppJVar6 + -0xb8));
      pvVar8 = AlphaVector::GetValues(&local_110);
      local_220 = (double)(**(code **)(*plVar7 + 0x80))(plVar7,pvVar8);
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)(local_b2 + 0x4a),(ulong)local_1ec);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(long)(int)local_b2._14_4_);
      local_b2._2_8_ = *pvVar9;
      if ((double)local_b2._2_8_ <= local_220) {
        iVar2 = Perseus::GetVerbose((Perseus *)(in_RSI + 0x18));
        if (iVar2 != 0) {
          in_stack_fffffffffffffc40 =
               (Perseus *)std::operator<<((ostream *)&std::cout,"Added vector for action ");
          in_stack_fffffffffffffc38 =
               (GaoVectorSet *)std::ostream::operator<<(in_stack_fffffffffffffc40,local_1ec);
          poVar10 = std::operator<<((ostream *)in_stack_fffffffffffffc38,", belief ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_b2._14_4_);
          poVar10 = std::operator<<(poVar10," (Q ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_220);
          poVar10 = std::operator<<(poVar10," >= ");
          in_stack_fffffffffffffc08 =
               (ostream *)std::ostream::operator<<(poVar10,(double)local_b2._2_8_);
          in_stack_fffffffffffffc00 = std::operator<<(in_stack_fffffffffffffc08,")");
          std::ostream::operator<<(in_stack_fffffffffffffc00,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      else {
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::operator[](local_20,(ulong)local_1ec);
        BeliefValue::GetMaximizingVector
                  ((BeliefSet *)rVar11._M_mask,in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8);
        AlphaVector::operator=(in_stack_fffffffffffffb88,(AlphaVector *)in_stack_fffffffffffffb80);
        AlphaVector::~AlphaVector((AlphaVector *)0x95f516);
      }
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator[](in_RDI,(ulong)local_1ec);
      bVar1 = AlphaVectorPlanning::VectorIsInValueFunction
                        ((AlphaVector *)in_stack_fffffffffffffba8,
                         (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffba0);
      if (!bVar1) {
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::operator[](in_RDI,(ulong)local_1ec);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffb90,
                   in_stack_fffffffffffffb88);
      }
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffb90,
                 in_stack_fffffffffffffb88);
      local_1ec = local_1ec + 1;
    }
    BeliefValue::GetValues
              ((BeliefSet *)in_stack_fffffffffffffc08,
               (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffc00);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb88);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90);
    local_264 = 0;
    for (local_268 = 0; local_268 != local_b2._26_4_; local_268 = local_268 + 1) {
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffba0,
                          (size_type)in_stack_fffffffffffffb98);
      local_278 = rVar11;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_278);
      in_stack_fffffffffffffbe4 = in_stack_fffffffffffffbe4 & 0xffffff;
      if (bVar1) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(long)local_268)
        ;
        in_stack_fffffffffffffbd8 = (ValueFunctionPOMDPDiscrete *)*pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_268)
        ;
        in_stack_fffffffffffffbe4 =
             CONCAT13(*pvVar9 <= (double)in_stack_fffffffffffffbd8,(int3)in_stack_fffffffffffffbe4);
      }
      if ((char)(in_stack_fffffffffffffbe4 >> 0x18) != '\0') {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffba0,
                            (size_type)in_stack_fffffffffffffb98);
        local_288 = rVar12;
        std::_Bit_reference::operator=(&local_288,false);
        local_b2._22_4_ = local_b2._22_4_ + -1;
        local_264 = local_264 + 1;
      }
    }
    in_stack_fffffffffffffbc4 = Perseus::GetVerbose((Perseus *)(in_RSI + 0x18));
    if (in_stack_fffffffffffffbc4 != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Added vectors for ");
      in_stack_fffffffffffffbb0 =
           (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)std::ostream::operator<<(poVar10,local_b2._14_4_);
      in_stack_fffffffffffffba8 =
           (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            *)std::operator<<((ostream *)in_stack_fffffffffffffbb0," (V ");
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_50,(long)(int)local_b2._14_4_);
      in_stack_fffffffffffffba0 =
           (AlphaVector *)std::ostream::operator<<(in_stack_fffffffffffffba8,*pvVar9);
      in_stack_fffffffffffffb98 = std::operator<<((ostream *)in_stack_fffffffffffffba0," improved ")
      ;
      in_stack_fffffffffffffb90 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb98,local_264);
      in_stack_fffffffffffffb88 = (AlphaVector *)std::operator<<(in_stack_fffffffffffffb90,")");
      std::ostream::operator<<(in_stack_fffffffffffffb88,std::endl<char,std::char_traits<char>>);
    }
  }
  this_01 = (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
             *)(in_RSI + 0x18);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  Perseus::BackupStageLeadOut(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(this_01);
  local_b2[1] = 1;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffb90);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(this_01);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffffb90);
  AlphaVector::~AlphaVector((AlphaVector *)0x95fb3b);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x95fb48)
  ;
  if ((local_b2[1] & 1) == 0) {
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_stack_fffffffffffffb90);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffb90);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90);
  return in_RDI;
}

Assistant:

QFunctionsDiscrete
PerseusBGNSPlanner::BackupStageSampling(const BeliefSet &S,
                                        const QFunctionsDiscrete &Q) 
    const
{
    vector<double> VB=BeliefValue::GetValues(S,Q),
        VBalpha;
    vector<vector<double> > QB;
    for(unsigned int a=0;a!=Q.size();++a)
        QB.push_back(BeliefValue::GetValues(S,Q[a]));

    int nrB=VB.size(),
        nrNotImproved=nrB,
        nrS=GetPU()->GetNrStates(),
        k;
    double oldValue;
    QFunctionsDiscrete Q1(Q.size());
    vector<bool> stillNeedToBeImproved(nrB,true);
    AlphaVector alpha(nrS);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Q);
    GaoVectorSet Gao=BackupStageLeadIn(V);

    ValueFunctionPOMDPDiscrete Qalphas;

    while(nrNotImproved!=0)
    {
        // sample a belief index from the number of not improved beliefs
        k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        Qalphas.clear();
        for(unsigned int a=0;a!=GetPU()->GetNrJointActions();++a)
        {
            // backup the belief
            alpha=AlphaVectorBG::BeliefBackup(*S[k],a,Gao,V,_m_backupType);

            // check whether alpha improves the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());

            // if not, get copy from old value function
            oldValue=QB[a][k];//VB[k]
            if(x<oldValue)
            {
#if DEBUG_PerseusBGNSPlanner
                cout << "Getting n-1 vector for action " << a << ", belief "
                     << k << " (" << x << " < " <<oldValue << ")" << endl;
#endif
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
            }
            else
            {
                if(GetVerbose())
                    cout << "Added vector for action " << a << ", belief " 
                         << k << " (Q " << x << " >= " << oldValue << ")"
                         << endl;
            }
            // add alpha to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);
            Qalphas.push_back(alpha);
        }

        // update which beliefs have been improved
        VBalpha=BeliefValue::GetValues(S,Qalphas);
        int nrImprovedByAlpha=0;
        for(int b=0;b!=nrB;b++)
            if(stillNeedToBeImproved[b] && VBalpha[b]>=VB[b])
            {
                stillNeedToBeImproved[b]=false;
                nrNotImproved--;
                nrImprovedByAlpha++;
            }

        if(GetVerbose())
            cout << "Added vectors for " << k << " (V " << VBalpha[k] 
                 << " improved " << nrImprovedByAlpha << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}